

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O3

string * iutest::detail::ToHexString<char>(string *__return_storage_ptr__,char *str,int length)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  char local_5b [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (length != 0) {
    lVar3 = 0;
    do {
      bVar1 = str[lVar3];
      if (bVar1 == 0) {
        return __return_storage_ptr__;
      }
      local_5b[0] = (bVar1 >> 4) + 0x30;
      if (0x9f < bVar1) {
        local_5b[0] = (bVar1 >> 4) + 0x37;
      }
      bVar1 = bVar1 & 0xf;
      local_5b[1] = bVar1 + 0x30;
      if (9 < bVar1) {
        local_5b[1] = bVar1 + 0x37;
      }
      local_5b[2] = 0;
      local_50[0] = local_40;
      sVar2 = strlen(local_5b);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,local_5b,local_5b + sVar2);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 < length || length < 0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(const T* str, int length)
{
    ::std::string r;
    for( int i=0; (length < 0 || i < length) && *str != 0; ++str, ++i)
    {
        r += ToHexString(*str);
    }
    return r;
}